

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cc
# Opt level: O2

void __thiscall xemmai::t_engine::f_collector(t_engine *this)

{
  t_object *ptVar1;
  mutex *this_00;
  t_internal *this_01;
  t_object *ptVar2;
  t_handle *ptVar3;
  t_object *ptVar4;
  size_t sVar5;
  t_object *ptVar6;
  t_object *ptVar7;
  ulong uVar8;
  pthread_mutex_t *ppVar9;
  t_object *ptVar10;
  t_handle *q;
  t_object *p;
  bool bVar11;
  t_internal *ptVar12;
  lock_guard<std::mutex> lock;
  long *in_FS_OFFSET;
  bool bVar13;
  anon_class_16_2_20c11228_for___vfn __vfn;
  lock_guard<std::mutex> lock_1;
  
  in_FS_OFFSET[-0xc] = (long)this;
  if ((this->v_options).v_verbose == true) {
    fwrite("collector starting...\n",0x16,1,_stderr);
  }
  ptVar1 = (t_object *)(*in_FS_OFFSET + -0x20);
  in_FS_OFFSET[-3] = (long)ptVar1;
  in_FS_OFFSET[-4] = (long)ptVar1;
  this_00 = &this->v_object__reviving__mutex;
  do {
    (this->v_collector__running).super___atomic_flag_base._M_i = false;
    std::__atomic_notify_address<bool>((bool *)this,true);
    __vfn.this = &this->v_collector__running;
    __vfn._0_8_ = 2;
    std::
    __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
              ((bool *)this,false,__vfn);
    if (this->v_collector__quitting != false) {
      if ((this->v_options).v_verbose == true) {
        fwrite("collector quitting...\n",0x16,1,_stderr);
      }
      (this->v_collector__running).super___atomic_flag_base._M_i = false;
      std::__atomic_notify_address<bool>((bool *)this,false);
      return;
    }
    this->v_collector__epoch = this->v_collector__epoch + 1;
    std::mutex::lock(&this->v_thread__mutex);
    this_01 = (t_internal *)&this->v_thread__internals;
    while (ptVar12 = this_01, this_01 = ptVar12->v_next, this_01 != (t_internal *)0x0) {
      if ((-1 < this_01->v_done) && (t_thread::t_internal::f_epoch(this_01), 2 < this_01->v_done)) {
        ptVar12->v_next = this_01->v_next;
        operator_delete(this_01,0xca0);
        this_01 = ptVar12;
      }
    }
    ptVar10 = (t_object *)0x0;
    ppVar9 = (pthread_mutex_t *)&this->v_thread__mutex;
LAB_00182f8c:
    pthread_mutex_unlock(ppVar9);
    if (this->v_cycles != (t_object *)0x0) {
      std::mutex::lock(this_00);
      ptVar6 = this->v_cycles;
      this->v_cycles = ptVar6->v_next_cycle;
      bVar11 = false;
      ptVar4 = ptVar6;
      do {
        while (ptVar7 = ptVar4->v_next, ppVar9 = (pthread_mutex_t *)this_00,
              ptVar7->v_type != (t_type *)0x0) {
          if (((ptVar7->v_color != c_color__ORANGE) || (ptVar7->v_cyclic != 0)) ||
             (ptVar7->v_reviving == true)) {
            bVar11 = true;
          }
          ptVar7->v_reviving = false;
          ptVar4 = ptVar7;
          if (ptVar7 == ptVar6) {
            if (ptVar6 == (t_object *)0x0) goto LAB_00182f8c;
            goto LAB_00183027;
          }
        }
        ptVar4->v_next = ptVar7->v_next;
        f_free_as_collect(this,ptVar7);
      } while (ptVar7 != ptVar6);
      bVar13 = ptVar4 != ptVar6;
      ptVar6 = ptVar4;
      ptVar7 = ptVar4;
      if (bVar13) {
LAB_00183027:
        if (bVar11) {
          if (ptVar6->v_color == c_color__ORANGE) {
            ptVar6->v_color = c_color__PURPLE;
          }
          ptVar4 = (t_object *)in_FS_OFFSET[-3];
          ptVar7 = ptVar6;
          do {
            ptVar2 = ptVar7->v_next;
            if (ptVar7->v_count == 0) {
              ptVar7->v_next = ptVar10;
              ptVar10 = ptVar7;
            }
            else if (ptVar7->v_color == c_color__PURPLE) {
              ptVar7->v_next = ptVar1;
              ptVar7->v_previous = ptVar4;
              in_FS_OFFSET[-3] = (long)ptVar7;
              ptVar4->v_next = ptVar7;
              ptVar4 = ptVar7;
            }
            else {
              ptVar7->v_color = c_color__BLACK;
              ptVar7->v_next = (t_object *)0x0;
            }
            ptVar7 = ptVar2;
          } while (ptVar2 != ptVar6);
        }
        else {
          do {
            ptVar7->v_color = c_color__RED;
            ptVar7 = ptVar7->v_next;
          } while (ptVar7 != ptVar6);
          do {
            t_object::f_cyclic_decrement(ptVar7);
            ptVar7 = ptVar7->v_next;
          } while (ptVar7 != ptVar6);
          do {
            ptVar4 = ptVar7->v_next;
            f_free_as_collect(this,ptVar7);
            ptVar7 = ptVar4;
          } while (ptVar4 != ptVar6);
        }
      }
      goto LAB_00182f8c;
    }
    while (ptVar10 != (t_object *)0x0) {
      ptVar6 = ptVar10->v_next;
      ptVar10->v_next = (t_object *)0x0;
      t_object::f_loop<&xemmai::t_object::f_decrement_step>(ptVar10);
      ptVar10 = ptVar6;
    }
    while (ptVar3 = this->v_library__handle__finalizing, ptVar3 != (t_handle *)0x0) {
      this->v_library__handle__finalizing = ptVar3->v_next;
      portable::t_library::~t_library(&ptVar3->v_library);
      operator_delete(ptVar3,0x10);
    }
    if ((t_object *)in_FS_OFFSET[-4] != ptVar1) {
      sVar5 = t_heap<xemmai::t_object>::f_live(&this->v_object__heap);
      uVar8 = this->v_object__lower;
      if (sVar5 < this->v_object__lower) {
        this->v_object__lower = sVar5;
        uVar8 = sVar5;
      }
      if ((this->v_options).v_collector__threshold <= sVar5 - uVar8) {
        this->v_object__lower = sVar5;
        this->v_collector__collect = this->v_collector__collect + 1;
        ptVar10 = (t_object *)in_FS_OFFSET[-4];
        ptVar6 = ptVar1;
        do {
          if (ptVar10->v_count == 0) {
            __assert_fail("q->v_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/engine.cc"
                          ,0x69,"void xemmai::t_engine::f_collector()");
          }
          if (ptVar10->v_color == c_color__PURPLE) {
            t_object::f_mark_gray(ptVar10);
            ptVar6 = ptVar10;
          }
          else {
            ptVar6->v_next = ptVar10->v_next;
            ptVar10->v_next = (t_object *)0x0;
          }
          ptVar10 = ptVar6->v_next;
        } while (ptVar10 != ptVar1);
        ptVar10 = (t_object *)in_FS_OFFSET[-4];
        if (ptVar10 != ptVar1) {
          do {
            t_object::f_scan_gray(ptVar10);
            ptVar10 = ptVar10->v_next;
          } while (ptVar10 != ptVar1);
          ptVar10 = (t_object *)in_FS_OFFSET[-4];
          do {
            in_FS_OFFSET[-4] = (long)ptVar10->v_next;
            if (ptVar10->v_color == c_color__WHITE) {
              t_object::f_collect_white(ptVar10);
              ptVar10 = (t_object *)in_FS_OFFSET[-1];
              ptVar6 = ptVar10;
              do {
                t_object::f_step<&xemmai::t_object::f_scan_red>(ptVar6);
                ptVar6 = ptVar6->v_next;
              } while (ptVar6 != ptVar10);
              do {
                ptVar6->v_color = c_color__ORANGE;
                ptVar6 = ptVar6->v_next;
              } while (ptVar6 != ptVar10);
              ptVar10->v_next_cycle = this->v_cycles;
              this->v_cycles = ptVar10;
            }
            else {
              ptVar10->v_next = (t_object *)0x0;
            }
            ptVar10 = (t_object *)in_FS_OFFSET[-4];
          } while (ptVar10 != ptVar1);
        }
        in_FS_OFFSET[-3] = (long)ptVar1;
      }
    }
    t_heap<xemmai::t_object>::f_flush(&this->v_object__heap);
  } while( true );
}

Assistant:

void t_engine::f_collector()
{
	v_instance = this;
	if (v_options.v_verbose) std::fprintf(stderr, "collector starting...\n");
	t_object::v_roots.v_next = t_object::v_roots.v_previous = reinterpret_cast<t_object*>(&t_object::v_roots);
	while (true) {
		v_collector__running.clear(std::memory_order_relaxed);
		v_collector__running.notify_all();
		v_collector__running.wait(false, std::memory_order_acquire);
		if (v_collector__quitting) break;
		++v_collector__epoch;
		{
			std::lock_guard lock(v_thread__mutex);
			for (auto p = &v_thread__internals; *p;) {
				auto q = *p;
				if (q->v_done >= 0) q->f_epoch();
				if (q->v_done < 3) {
					p = &q->v_next;
				} else {
					*p = q->v_next;
					delete q;
				}
			}
		}
		t_object* garbage = nullptr;
		while (v_cycles) {
			std::lock_guard lock(v_object__reviving__mutex);
			auto cycle = v_cycles;
			v_cycles = cycle->v_next_cycle;
			auto failed = false;
			auto p = cycle;
			while (true) {
				auto q = p->v_next;
				if (q->v_type) {
					if (q->v_color != c_color__ORANGE || q->v_cyclic > 0 || q->v_reviving) failed = true;
					q->v_reviving = false;
					p = q;
					if (p == cycle) break;
				} else {
					p->v_next = q->v_next;
					f_free_as_collect(q);
					if (q == cycle) {
						cycle = p == q ? nullptr : p;
						break;
					}
				}
			}
			if (!cycle) continue;
			if (failed) {
				p = cycle;
				if (p->v_color == c_color__ORANGE) p->v_color = c_color__PURPLE;
				do {
					auto q = p->v_next;
					if (p->v_count <= 0) {
						p->v_next = garbage;
						garbage = p;
					} else if (p->v_color == c_color__PURPLE) {
						t_object::f_append(p);
					} else {
						p->v_color = c_color__BLACK;
						p->v_next = nullptr;
					}
					p = q;
				} while (p != cycle);
			} else {
				do p->v_color = c_color__RED; while ((p = p->v_next) != cycle);
				do p->f_cyclic_decrement(); while ((p = p->v_next) != cycle);
				do {
					auto q = p->v_next;
					f_free_as_collect(p);
					p = q;
				} while (p != cycle);
			}
		}
		while (garbage) {
			auto p = garbage;
			garbage = p->v_next;
			p->v_next = nullptr;
			p->f_loop<&t_object::f_decrement_step>();
		}
		for (auto& p = v_library__handle__finalizing; p;) {
			auto q = p;
			p = q->v_next;
			delete q;
		}
		auto roots = reinterpret_cast<t_object*>(&t_object::v_roots);
		if (roots->v_next != roots) {
			auto live = v_object__heap.f_live();
			if (live < v_object__lower) v_object__lower = live;
			if (live - v_object__lower >= v_options.v_collector__threshold) {
				v_object__lower = live;
				++v_collector__collect;
				{
					auto p = roots;
					auto q = p->v_next;
					do {
						assert(q->v_count > 0);
						if (q->v_color == c_color__PURPLE) {
							q->f_mark_gray();
							p = q;
						} else {
							p->v_next = q->v_next;
							q->v_next = nullptr;
						}
						q = p->v_next;
					} while (q != roots);
				}
				if (roots->v_next != roots) {
					{
						auto p = roots->v_next;
						do p->f_scan_gray(); while ((p = p->v_next) != roots);
					}
					do {
						auto p = roots->v_next;
						roots->v_next = p->v_next;
						if (p->v_color == c_color__WHITE) {
							p->f_collect_white();
							auto cycle = t_object::v_cycle;
							auto q = cycle;
							do q->f_step<&t_object::f_scan_red>(); while ((q = q->v_next) != cycle);
							do q->v_color = c_color__ORANGE; while ((q = q->v_next) != cycle);
							cycle->v_next_cycle = v_cycles;
							v_cycles = cycle;
						} else {
							p->v_next = nullptr;
						}
					} while (roots->v_next != roots);
				}
				roots->v_previous = roots;
			}
		}
		v_object__heap.f_flush();
	}
	if (v_options.v_verbose) std::fprintf(stderr, "collector quitting...\n");
	v_collector__running.clear(std::memory_order_relaxed);
	v_collector__running.notify_one();
}